

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

char * cs_impl::
       try_convert_and_check<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_1UL>
       ::convert(var *val)

{
  bool bVar1;
  char **ppcVar2;
  runtime_error *this;
  string *str;
  char *in_stack_000002c8;
  any *in_stack_fffffffffffffe70;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  undefined1 uVar3;
  type_info *in_stack_fffffffffffffe80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  char *local_8;
  
  any::type(in_stack_fffffffffffffe70);
  bVar1 = std::type_info::operator==
                    (in_stack_fffffffffffffe80,
                     (type_info *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
  if (bVar1) {
    convert_helper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::get_val((any *)0x438f7e);
    local_8 = type_convertor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
              ::convert((string *)0x438f86);
  }
  else {
    any::type(in_stack_fffffffffffffe70);
    bVar1 = std::type_info::operator==
                      (in_stack_fffffffffffffe80,
                       (type_info *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
    if (!bVar1) {
      uVar3 = 1;
      this = (runtime_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffea8);
      std::operator+((char *)CONCAT17(uVar3,in_stack_fffffffffffffe78),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(uVar3,in_stack_fffffffffffffe78),(char *)this);
      str = (string *)get_name_of_type<char_const*>();
      cxx_demangle_abi_cxx11_(in_stack_000002c8);
      std::operator+(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(uVar3,in_stack_fffffffffffffe78),(char *)this);
      get_name_of_type<std::__cxx11::string>();
      cxx_demangle_abi_cxx11_(in_stack_000002c8);
      std::operator+(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(uVar3,in_stack_fffffffffffffe78),(char *)this);
      any::get_type_name_abi_cxx11_((any *)CONCAT17(uVar3,in_stack_fffffffffffffe78));
      std::operator+(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
      cs::runtime_error::runtime_error(this,str);
      __cxa_throw(this,&cs::runtime_error::typeinfo,cs::runtime_error::~runtime_error);
    }
    ppcVar2 = convert_helper<const_char_*>::get_val((any *)0x438fc2);
    local_8 = *ppcVar2;
  }
  return local_8;
}

Assistant:

inline static _TargetT convert(cs::var &val)
		{
			if (val.type() == typeid(_SourceT))
				return type_convertor<_SourceT, _TargetT>::convert(convert_helper<_SourceT>::get_val(val));
			else if (val.type() == typeid(_TargetT))
				return convert_helper<_TargetT>::get_val(val);
			else
				throw cs::runtime_error("Invalid Argument. At " + std::to_string(index + 1) + ". Expected " +
				                        cxx_demangle(get_name_of_type<_TargetT>()) + ", compatible with " +
				                        cxx_demangle(get_name_of_type<_SourceT>()) + ", provided " +
				                        val.get_type_name());
		}